

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
SerializePointer<vertex_t>
          (FSerializer *arc,char *key,vertex_t **value,vertex_t **defval,vertex_t *base)

{
  uint uVar1;
  vertex_t *pvVar2;
  int64_t vv;
  ulong local_30;
  
  if (base == (vertex_t *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = vertex_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if ((((uVar1 != 0) && (defval != (vertex_t **)0x0)) &&
        ((arc->w->mInObject).Array[uVar1 - 1] != false)) && (*value == *defval)) {
      return arc;
    }
  }
  local_30 = -(ulong)(*value == (vertex_t *)0x0) | (long)*value - (long)base >> 4;
  Serialize(arc,key,(int64_t *)&local_30,(int64_t *)0x0);
  pvVar2 = base + local_30;
  if ((long)local_30 < 0) {
    pvVar2 = (vertex_t *)0x0;
  }
  *value = pvVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}